

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManComputeBackward3(Of_Man_t *p)

{
  word *pwVar1;
  uint *puVar2;
  int *piVar3;
  int iVar4;
  Jf_Par_t *pJVar5;
  Gia_Obj_t *pGVar6;
  undefined8 uVar7;
  Of_Obj_t *pOVar8;
  int *piVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  uint *pCut;
  long lVar21;
  long lVar22;
  uint *pCut_00;
  
  iVar4 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,0);
  pJVar5 = p->pPars;
  pJVar5->Area = 0;
  pJVar5->Edge = 0;
  lVar21 = (long)p->pGia->nObjs;
  if (1 < lVar21) {
    do {
      if (p->pGia->nObjs < lVar21) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar6 = p->pGia->pObjs;
      if (pGVar6 == (Gia_Obj_t *)0x0) {
        return;
      }
      lVar22 = lVar21 + -1;
      uVar7 = *(undefined8 *)(pGVar6 + lVar22);
      uVar13 = (uint)uVar7;
      if ((~uVar13 & 0x1fffffff) != 0 && -1 < (int)uVar13) {
        pOVar8 = p->pObjs;
        iVar18 = pOVar8[lVar22].Required;
        if ((((int)uVar13 < 0) || ((uVar13 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar13 & 0x1fffffff) != ((uint)((ulong)uVar7 >> 0x20) & 0x1fffffff))) {
          if (pOVar8[lVar22].nRefs != 0) {
            uVar13 = pOVar8[lVar22].iCutH >> 0x10;
            if (((int)uVar13 < 0) || ((p->vPages).nSize <= (int)uVar13)) {
LAB_00786e9a:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            iVar11 = Of_CutDeref_rec(p,(int *)((ulong)((pOVar8[lVar22].iCutH & 0xffffU) << 2) +
                                              (long)(p->vPages).pArray[uVar13]));
            if ((p->vCutSets).nSize < lVar21) {
LAB_00786eb9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar13 = (p->vCutSets).pArray[lVar22];
            uVar14 = (int)uVar13 >> 0x10;
            if (((int)uVar14 < 0) || ((p->vPages).nSize <= (int)uVar14)) goto LAB_00786e9a;
            puVar2 = (uint *)((long)(p->vPages).pArray[uVar14] + (ulong)(uVar13 & 0xffff) * 4);
            if ((int)*puVar2 < 1) {
              pCut = (uint *)0x0;
            }
            else {
              pCut_00 = puVar2 + 1;
              iVar20 = 1000000000;
              iVar17 = 0;
              pCut = (uint *)0x0;
              do {
                if ((int)pCut_00[(ulong)(*pCut_00 & 0x1f) + 1] <= iVar18) {
                  if ((p->vCutRefs).nSize != 0) {
                    __assert_fail("Vec_IntSize(&p->vCutRefs) == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                                  ,0x440,"int Of_CutAreaDerefed2(Of_Man_t *, int *)");
                  }
                  iVar12 = Of_CutRef2_rec(p,(int *)pCut_00);
                  lVar16 = (long)(p->vCutRefs).nSize;
                  if (0 < lVar16) {
                    piVar9 = (p->vCutRefs).pArray;
                    pOVar8 = p->pObjs;
                    lVar19 = 0;
                    do {
                      piVar3 = &pOVar8[piVar9[lVar19]].nRefs;
                      *piVar3 = *piVar3 + -1;
                      lVar19 = lVar19 + 1;
                    } while (lVar16 != lVar19);
                  }
                  (p->vCutRefs).nSize = 0;
                  if (iVar12 < iVar20) {
                    pCut = pCut_00;
                  }
                  if (iVar12 <= iVar20) {
                    iVar20 = iVar12;
                  }
                }
                iVar17 = iVar17 + 1;
                pCut_00 = pCut_00 + (ulong)(*pCut_00 & 0x1f) + 4;
              } while (iVar17 < (int)*puVar2);
            }
            if (pCut == (uint *)0x0) {
              __assert_fail("pCutMin != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                            ,0x500,"void Of_ManComputeBackward3(Of_Man_t *)");
            }
            if ((p->vCutSets).nSize < lVar21) goto LAB_00786eb9;
            if (pCut < puVar2 || (long)pCut - (long)puVar2 == 0) {
              __assert_fail("pCut > pCutSet",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                            ,0x6c,"int Of_CutHandle(int *, int *)");
            }
            pOVar8 = p->pObjs;
            pOVar8[lVar22].iCutH =
                 (int)((ulong)((long)pCut - (long)puVar2) >> 2) + (p->vCutSets).pArray[lVar22];
            if ((*pCut & 0x1f) != 0) {
              iVar18 = iVar18 - iVar4;
              uVar15 = 0;
              do {
                uVar13 = pCut[uVar15 + 1];
                if ((int)uVar13 < 0) {
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                if (uVar13 < 2) break;
                if (iVar18 < pOVar8[uVar13 >> 1].Required) {
                  pOVar8[uVar13 >> 1].Required = iVar18;
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 < (*pCut & 0x1f));
            }
            iVar18 = Of_CutRef_rec(p,(int *)pCut);
            if (iVar11 < iVar18) {
              __assert_fail("AreaAft <= AreaBef",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaOf.c"
                            ,0x506,"void Of_ManComputeBackward3(Of_Man_t *)");
            }
            pJVar5 = p->pPars;
            pwVar1 = &pJVar5->Edge;
            *pwVar1 = *pwVar1 + (ulong)(*pCut & 0x1f);
            pwVar1 = &pJVar5->Area;
            *pwVar1 = *pwVar1 + 1;
          }
        }
        else {
          lVar16 = lVar22 - (ulong)(uVar13 & 0x1fffffff);
          if (iVar18 < pOVar8[lVar16].Required) {
            pOVar8[lVar16].Required = iVar18;
          }
        }
      }
      bVar10 = 2 < lVar21;
      lVar21 = lVar22;
    } while (bVar10);
  }
  return;
}

Assistant:

void Of_ManComputeBackward3( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pList, * pCut, * pCutMin;
    int AreaBef = 0, AreaAft = 0;
    Of_ManComputeOutputRequired( p, 0 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int CostMin, Cost, Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // deref best cut
        AreaBef = Of_CutDeref_rec( p, Of_ObjCutBestP(p, i) );        
        // select the best cut
        pCutMin = NULL;
        CostMin = ABC_INFINITY;
        pList = Of_ObjCutSet( p, i );
        Of_SetForEachCut( pList, pCut, k )
        {
            if ( Of_CutDelay1(pCut) > Required )
                continue;
            Cost = Of_CutAreaDerefed2( p, pCut );
            if ( CostMin > Cost )
            {
                CostMin = Cost;
                pCutMin = pCut;
            }
        }
        // the cut is selected
        assert( pCutMin != NULL );
        Of_ObjSetCutBestP( p, pList, i, pCutMin );
        Of_CutForEachVar( pCutMin, iVar, k )
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
        // ref best cut
        AreaAft = Of_CutRef_rec( p, pCutMin );
        assert( AreaAft <= AreaBef );
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}